

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmvmesh.cpp
# Opt level: O0

void __thiscall TPZMVGraphMesh::DrawMesh(TPZMVGraphMesh *this,int numcases)

{
  ostream *poVar1;
  void *this_00;
  int in_ESI;
  long *in_RDI;
  int i;
  int local_10;
  
  *(int *)(in_RDI + 0xa1) = in_ESI;
  *(undefined4 *)((long)in_RDI + 0x50c) = 0;
  poVar1 = std::operator<<((ostream *)(in_RDI + 0x51),"%HEADER");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)(in_RDI + 0x51),"Arquivo gerado por PZ");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)(in_RDI + 0x51),"%RESULT\n1");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = (ostream *)std::ostream::operator<<(in_RDI + 0x51,1);
  poVar1 = std::operator<<(poVar1," \'Caso Unico\'");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)(in_RDI + 0x51),"%RESULT.CASE");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = (ostream *)std::ostream::operator<<(in_RDI + 0x51,1);
  poVar1 = std::operator<<(poVar1," ");
  this_00 = (void *)std::ostream::operator<<(poVar1,in_ESI);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  for (local_10 = 0; local_10 < in_ESI; local_10 = local_10 + 1) {
    poVar1 = (ostream *)std::ostream::operator<<(in_RDI + 0x51,local_10 + 1);
    poVar1 = std::operator<<(poVar1," \'step");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_10);
    poVar1 = std::operator<<(poVar1,"\'");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  (**(code **)(*in_RDI + 0x50))();
  (**(code **)(*in_RDI + 0x60))(in_RDI,7);
  return;
}

Assistant:

void TPZMVGraphMesh::DrawMesh(int numcases) {
	
	fNumCases = numcases;
	fNumSteps = 0;
	(fOutFile) << "%HEADER" << endl;
	(fOutFile) << "Arquivo gerado por PZ" << endl;
	(fOutFile) << "%RESULT\n1" << endl;
	(fOutFile) << 1 << " 'Caso Unico'" << endl;
	(fOutFile) << "%RESULT.CASE" << endl;
	(fOutFile) << 1 << " " << numcases << endl;
	for(int i=0; i<numcases;i++) {
		(fOutFile) << (i+1) << " 'step" << i << "'" << endl;
	}
	DrawNodes();
	DrawConnectivity(ECube);
}